

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManSetFlowRefs(Gia_Man_t *p,Vec_Flt_t *vRefs,Vec_Int_t *vOffsets)

{
  float *pfVar1;
  undefined8 uVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  float *pfVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  uVar13 = (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs;
  if (vRefs->nCap < (int)uVar13) {
    if (vRefs->pArray == (float *)0x0) {
      pfVar7 = (float *)malloc((long)(int)uVar13 << 2);
    }
    else {
      pfVar7 = (float *)realloc(vRefs->pArray,(long)(int)uVar13 << 2);
    }
    vRefs->pArray = pfVar7;
    vRefs->nCap = uVar13;
  }
  if (0 < (int)uVar13) {
    memset(vRefs->pArray,0,(ulong)uVar13 << 2);
  }
  vRefs->nSize = uVar13;
  uVar13 = p->nObjs;
  uVar11 = (ulong)uVar13;
  if (0 < (int)uVar13) {
    lVar16 = 0;
    lVar17 = 0;
    do {
      uVar13 = (uint)uVar11;
      pGVar8 = p->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      pGVar4 = (Gia_Obj_t *)(&pGVar8->field_0x0 + lVar16);
      uVar11 = *(ulong *)pGVar4;
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar11) {
        uVar2 = *(undefined8 *)
                 ((long)pGVar8 + lVar16 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        uVar14 = (uint)uVar2;
        if (((~uVar14 & 0x1fffffff) == 0 || (int)uVar14 < 0) ||
           ((((uint)((ulong)uVar2 >> 0x20) ^ uVar14) & 0x1fffffff) == 0)) {
          bVar15 = 0;
        }
        else {
          uVar11 = (ulong)-((uint)uVar11 & 0x1fffffff) + lVar17;
          iVar6 = (int)uVar11;
          if ((iVar6 < 0) || (vOffsets->nSize <= iVar6)) goto LAB_006db1d9;
          lVar12 = (long)vOffsets->pArray[uVar11 & 0xffffffff];
          if ((lVar12 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar11 & 0xffffffff]))
          goto LAB_006db1ba;
          vRefs->pArray[lVar12] = vRefs->pArray[lVar12] + 1.0;
          uVar11 = *(ulong *)pGVar4;
          bVar15 = (byte)(uVar11 >> 0x1f) & 1;
        }
        uVar10 = (uint)(uVar11 >> 0x20);
        uVar14 = uVar10 & 0x1fffffff;
        if (((bVar15 != 0) || (uVar9 = (uint)uVar11 & 0x1fffffff, uVar9 == 0x1fffffff)) ||
           (uVar9 != uVar14)) {
          uVar2 = *(undefined8 *)((long)pGVar8 + lVar16 + (ulong)((uVar10 & 0x1fffffff) << 2) * -3);
          uVar10 = (uint)uVar2;
          if (((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) &&
             ((((uint)((ulong)uVar2 >> 0x20) ^ uVar10) & 0x1fffffff) != 0)) {
            uVar11 = (ulong)-uVar14 + lVar17;
            iVar6 = (int)uVar11;
            if ((iVar6 < 0) || (vOffsets->nSize <= iVar6)) goto LAB_006db1d9;
            lVar12 = (long)vOffsets->pArray[uVar11 & 0xffffffff];
            if ((lVar12 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar11 & 0xffffffff]))
            goto LAB_006db1ba;
            vRefs->pArray[lVar12] = vRefs->pArray[lVar12] + 1.0;
          }
          puVar3 = p->pMuxes;
          if (puVar3 == (uint *)0x0) {
            iVar6 = Gia_ObjIsMuxType(pGVar4);
            if (iVar6 != 0) {
              pGVar8 = Gia_ObjRecognizeMux(pGVar4,&local_40,&local_38);
              pGVar8 = (Gia_Obj_t *)((ulong)pGVar8 & 0xfffffffffffffffe);
              local_38 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
              local_40 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
              uVar13 = (uint)*(undefined8 *)pGVar8;
              if (((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) &&
                 ((((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) ^ uVar13) & 0x1fffffff) != 0)) {
                pGVar4 = p->pObjs;
                if ((pGVar8 < pGVar4) || (pGVar4 + p->nObjs <= pGVar8)) goto LAB_006db217;
                uVar13 = (int)((long)pGVar8 - (long)pGVar4 >> 2) * -0x55555555;
                if (((int)uVar13 < 0) || (vOffsets->nSize <= (int)uVar13)) goto LAB_006db1d9;
                lVar12 = (long)vOffsets->pArray[uVar13 & 0x7fffffff];
                if ((lVar12 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar13 & 0x7fffffff]))
                goto LAB_006db1ba;
                vRefs->pArray[lVar12] = vRefs->pArray[lVar12] + -1.0;
              }
              if (local_38 == local_40) {
                uVar13 = (uint)*(undefined8 *)local_38;
                if (((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) &&
                   ((((uint)((ulong)*(undefined8 *)local_38 >> 0x20) ^ uVar13) & 0x1fffffff) != 0))
                {
                  pGVar8 = p->pObjs;
                  if ((local_38 < pGVar8) || (pGVar8 + p->nObjs <= local_38)) {
LAB_006db217:
                    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                  }
                  uVar13 = (int)((long)local_38 - (long)pGVar8 >> 2) * -0x55555555;
                  if ((-1 < (int)uVar13) && ((int)uVar13 < vOffsets->nSize)) {
                    uVar13 = vOffsets->pArray[uVar13 & 0x7fffffff];
                    if (-1 < (int)uVar13) {
                      fVar18 = -1.0;
                      goto LAB_006db06c;
                    }
                    goto LAB_006db1ba;
                  }
                  goto LAB_006db1d9;
                }
              }
            }
          }
          else if (puVar3[lVar17] != 0) {
            uVar14 = puVar3[lVar17];
            if ((int)uVar14 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            uVar10 = uVar14 >> 1;
            if (uVar13 <= uVar10) goto LAB_006db19b;
            uVar13 = (uint)*(undefined8 *)(pGVar8 + uVar10);
            if (((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) &&
               ((((uint)((ulong)*(undefined8 *)(pGVar8 + uVar10) >> 0x20) ^ uVar13) & 0x1fffffff) !=
                0)) {
              if ((uVar14 == 0) || (vOffsets->nSize <= (int)uVar10)) goto LAB_006db1d9;
              uVar13 = vOffsets->pArray[uVar10];
              if ((int)uVar13 < 0) goto LAB_006db1ba;
              fVar18 = 1.0;
LAB_006db06c:
              if (vRefs->nSize <= (int)uVar13) goto LAB_006db1ba;
              vRefs->pArray[uVar13] = fVar18 + vRefs->pArray[uVar13];
            }
          }
        }
      }
      lVar17 = lVar17 + 1;
      uVar13 = p->nObjs;
      uVar11 = (ulong)(int)uVar13;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < (long)uVar11);
  }
  lVar16 = (long)p->vCos->nSize;
  if (0 < lVar16) {
    piVar5 = p->vCos->pArray;
    lVar17 = 0;
    do {
      iVar6 = piVar5[lVar17];
      if (((long)iVar6 < 0) || ((int)uVar13 <= iVar6)) {
LAB_006db19b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar14 = iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff);
      if (((int)uVar14 < 0) || (uVar13 <= uVar14)) goto LAB_006db19b;
      uVar2 = *(undefined8 *)(p->pObjs + uVar14);
      uVar10 = (uint)uVar2;
      if (((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) &&
         ((((uint)((ulong)uVar2 >> 0x20) ^ uVar10) & 0x1fffffff) != 0)) {
        if (vOffsets->nSize <= (int)uVar14) {
LAB_006db1d9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar12 = (long)vOffsets->pArray[uVar14];
        if ((lVar12 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar14])) {
LAB_006db1ba:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                        ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
        }
        vRefs->pArray[lVar12] = vRefs->pArray[lVar12] + 1.0;
      }
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  iVar6 = vRefs->nSize;
  if (0 < (long)iVar6) {
    pfVar7 = vRefs->pArray;
    lVar16 = 0;
    do {
      pfVar1 = pfVar7 + lVar16;
      if (*pfVar1 <= 1.0 && *pfVar1 != 1.0) {
        pfVar7[lVar16] = 1.0;
      }
      lVar16 = lVar16 + 1;
    } while (iVar6 != lVar16);
  }
  return;
}

Assistant:

void Lf_ManSetFlowRefs( Gia_Man_t * p, Vec_Flt_t * vRefs, Vec_Int_t * vOffsets )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_FltFill( vRefs, Gia_ManAndNotBufNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId0(pObj, i)), 1 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId1(pObj, i)), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p, pObj)) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId2(p, i)), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAndNotBuf(pCtrl) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pCtrl)), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAndNotBuf(pData0) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pData0)), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p, Id)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Id), 1 );
    for ( i = 0; i < Vec_FltSize(vRefs); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}